

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall addrman_tests::addrman_getaddr::test_method(addrman_getaddr *this)

{
  pointer pCVar1;
  _func_int **pp_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  __single_object _Var5;
  bool bVar6;
  int32_t consistency_check_ratio;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  time_point tVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_t sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pCVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  uint uVar14;
  long lVar15;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<CAddress> __l_01;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar16;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  undefined4 local_624;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  size_t local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  size_t percent23;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  vector<CAddress,_std::allocator<CAddress>_> vAddr1;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  __single_object addrman;
  size_t *local_430;
  int octet2;
  undefined4 uStack_424;
  int octet1;
  undefined4 uStack_41c;
  char *local_418;
  undefined **local_410 [2];
  undefined1 *local_400 [2];
  undefined2 local_3f0;
  long local_3e8;
  undefined8 uStack_3e0;
  direct_or_indirect local_3d8;
  uint local_3c8;
  size_t **local_3c0;
  undefined2 local_3b8;
  vector<CAddress,_std::allocator<CAddress>_> vAddr;
  string local_390;
  direct_or_indirect local_370;
  uint local_360;
  undefined8 local_358;
  undefined2 local_350;
  direct_or_indirect local_348;
  uint local_338;
  undefined8 local_330;
  undefined2 local_328;
  string strAddr;
  direct_or_indirect local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  undefined2 local_2e0;
  long local_2d8;
  undefined8 uStack_2d0;
  prevector<16U,_unsigned_char,_unsigned_int,_int> local_2c8;
  undefined8 local_2b0;
  undefined2 local_2a8;
  long local_2a0;
  undefined8 uStack_298;
  prevector<16U,_unsigned_char,_unsigned_int,_int> local_290;
  undefined8 local_278;
  undefined2 local_270;
  long local_268;
  undefined8 uStack_260;
  direct_or_indirect local_258;
  uint local_248;
  direct_or_indirect local_238;
  uint local_228;
  direct_or_indirect local_218;
  uint local_208;
  undefined8 local_200;
  undefined2 local_1f8;
  direct_or_indirect local_1f0;
  uint local_1e0;
  undefined8 local_1d8;
  undefined2 local_1d0;
  long local_1c8;
  undefined8 uStack_1c0;
  direct_or_indirect local_1b8;
  uint local_1a8;
  undefined8 local_1a0;
  undefined2 local_198;
  char *local_190 [2];
  uint local_180;
  undefined8 local_178;
  undefined2 local_170;
  long local_168;
  undefined8 uStack_160;
  direct_or_indirect local_158;
  uint local_148;
  undefined8 local_140;
  undefined2 local_138;
  direct_or_indirect local_130;
  shared_count sStack_120;
  undefined8 local_118;
  undefined2 local_110;
  long local_108;
  undefined8 uStack_100;
  direct_or_indirect local_f8;
  uint local_e8;
  undefined8 local_e0;
  undefined2 local_d8;
  undefined1 local_d0 [24];
  char *local_b8;
  undefined2 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  undefined **local_70 [2];
  undefined1 *local_60;
  direct_or_indirect *local_58;
  undefined2 local_50;
  long local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio =
       GetCheckRatio((NodeContext *)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17d;
  file.m_begin = (iterator)&local_448;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_458,msg);
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_013ae088;
  local_d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_238.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  local_1f0.indirect_contents.indirect = (char *)&local_238;
  local_130.direct[0] = local_238.indirect_contents.indirect == (char *)0x0;
  local_410[0] = (undefined **)&local_258;
  local_258._0_4_ = 0;
  local_130._8_8_ = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_190[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_190[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
                         + 0x5f);
  local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
  local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_70[1]._0_1_ = '\0';
  local_70[0] = &PTR__lazy_ostream_013ae108;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_2f0._8_8_ = &local_1f0;
  local_58 = (direct_or_indirect *)local_410;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_130.indirect_contents,(lazy_ostream *)local_d0,1,2,REQUIRE,
             0xe59af2,(size_t)local_190,0x17d,&local_300,"0U",local_70);
  boost::detail::shared_count::~shared_count(&sStack_120);
  pvVar12 = (iterator)0x0;
  pvVar13 = (iterator)0x1;
  AddrMan::GetAddr(&vAddr1,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x17f;
  file_00.m_begin = (iterator)&local_480;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_490,
             msg_00);
  local_238.indirect_contents.indirect =
       (char *)(((long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  local_130.direct[0] =
       vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1f0.indirect_contents.indirect = (char *)&local_238;
  local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
  local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_410[0] = (undefined **)&local_258;
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_013ae088;
  local_d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_258._0_4_ = 0;
  local_70[1]._0_1_ = '\0';
  local_130._8_8_ = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_70[0] = &PTR__lazy_ostream_013ae108;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_190[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_190[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
                         + 0x5f);
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_2f0._8_8_ = &local_1f0;
  local_58 = (direct_or_indirect *)local_410;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_130.indirect_contents,(lazy_ostream *)local_d0,1,2,REQUIRE,
             0xe5a5ce,(size_t)local_190,0x17f,&local_300,"0U",local_70);
  boost::detail::shared_count::~shared_count(&sStack_120);
  local_300.indirect_contents.indirect = (char *)&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"250.250.2.1","");
  ResolveService((CService *)&local_98.indirect_contents,(string *)&local_300.indirect_contents,
                 0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_70,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  local_58 = (direct_or_indirect *)local_80;
  local_50 = local_78;
  local_48 = 100000000;
  uStack_40 = 0;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.indirect_contents.indirect != &local_2f0) {
    operator_delete(local_300.indirect_contents.indirect,
                    (ulong)(local_2f0._M_allocated_capacity + 1));
  }
  tVar7 = NodeClock::now();
  local_48 = (long)tVar7.__d.__r / 1000000000;
  local_300.indirect_contents.indirect = (char *)&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"250.251.2.2","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&local_300.indirect_contents,9999
                );
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d0,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  local_b8 = (char *)local_e0;
  local_b0 = local_d8;
  local_a8 = 100000000;
  uStack_a0 = 0;
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.indirect_contents.indirect != &local_2f0) {
    operator_delete(local_300.indirect_contents.indirect,
                    (ulong)(local_2f0._M_allocated_capacity + 1));
  }
  tVar7 = NodeClock::now();
  local_a8 = (long)tVar7.__d.__r / 1000000000;
  local_300.indirect_contents.indirect = (char *)&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"251.252.2.3","");
  ResolveService((CService *)&local_158.indirect_contents,(string *)&local_300.indirect_contents,
                 0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_130.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_158.indirect_contents);
  local_118 = local_140;
  local_110 = local_138;
  local_108 = 100000000;
  uStack_100 = 0;
  if (0x10 < local_148) {
    free(local_158.indirect_contents.indirect);
    local_158.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.indirect_contents.indirect != &local_2f0) {
    operator_delete(local_300.indirect_contents.indirect,
                    (ulong)(local_2f0._M_allocated_capacity + 1));
  }
  tVar7 = NodeClock::now();
  local_108 = (long)tVar7.__d.__r / 1000000000;
  local_300.indirect_contents.indirect = (char *)&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"252.253.3.4","");
  ResolveService((CService *)&local_1b8.indirect_contents,(string *)&local_300.indirect_contents,
                 0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_190,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1b8.indirect_contents);
  local_178 = local_1a0;
  local_170 = local_198;
  local_168 = 100000000;
  uStack_160 = 0;
  if (0x10 < local_1a8) {
    free(local_1b8.indirect_contents.indirect);
    local_1b8.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.indirect_contents.indirect != &local_2f0) {
    operator_delete(local_300.indirect_contents.indirect,
                    (ulong)(local_2f0._M_allocated_capacity + 1));
  }
  tVar7 = NodeClock::now();
  local_168 = (long)tVar7.__d.__r / 1000000000;
  local_300.indirect_contents.indirect = (char *)&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"252.254.4.5","");
  ResolveService((CService *)&local_218.indirect_contents,(string *)&local_300.indirect_contents,
                 0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_218.indirect_contents);
  local_1d8 = local_200;
  local_1d0 = local_1f8;
  local_1c8 = 100000000;
  uStack_1c0 = 0;
  if (0x10 < local_208) {
    free(local_218.indirect_contents.indirect);
    local_218.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.indirect_contents.indirect != &local_2f0) {
    operator_delete(local_300.indirect_contents.indirect,
                    (ulong)(local_2f0._M_allocated_capacity + 1));
  }
  tVar7 = NodeClock::now();
  local_1c8 = (long)tVar7.__d.__r / 1000000000;
  local_300.indirect_contents.indirect = (char *)&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"250.1.2.1","");
  ResolveIP((CNetAddr *)&local_238.indirect_contents,(string *)&local_300.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.indirect_contents.indirect != &local_2f0) {
    operator_delete(local_300.indirect_contents.indirect,
                    (ulong)(local_2f0._M_allocated_capacity + 1));
  }
  local_300.indirect_contents.indirect = (char *)&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"250.2.3.3","");
  ResolveIP((CNetAddr *)&local_258.indirect_contents,(string *)&local_300.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.indirect_contents.indirect != &local_2f0) {
    operator_delete(local_300.indirect_contents.indirect,
                    (ulong)(local_2f0._M_allocated_capacity + 1));
  }
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x18f;
  file_01.m_begin = (iterator)&local_4a0;
  msg_01.m_end = pvVar13;
  msg_01.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4b0,
             msg_01);
  _Var5 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_70);
  local_2f0._8_8_ = local_58;
  local_2e0 = local_50;
  local_2d8 = local_48;
  uStack_2d0 = uStack_40;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_2c8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_130.indirect_contents);
  local_2b0 = local_118;
  local_2a8 = local_110;
  local_2a0 = local_108;
  uStack_298 = uStack_100;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_290,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0.indirect_contents);
  local_278 = local_1d8;
  local_270 = local_1d0;
  local_268 = local_1c8;
  uStack_260 = uStack_1c0;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_300;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390,__l,(allocator_type *)&octet1
            );
  _cVar16 = 0x22c375;
  bVar6 = AddrMan::Add((AddrMan *)
                       _Var5._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_390,
                       (CNetAddr *)&local_238.indirect_contents,(seconds)0x0);
  strAddr._M_dataplus._M_p._0_1_ = bVar6;
  strAddr._M_string_length = 0;
  strAddr.field_2._M_allocated_capacity = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19ee20;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe5a658;
  local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
  local_410[0] = &PTR__lazy_ostream_013ae1c8;
  local_400[0] = boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4b8 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_400[1] = (undefined1 *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strAddr,(lazy_ostream *)local_410,1,0,WARN,_cVar16,
             (size_t)&local_4c0,399);
  boost::detail::shared_count::~shared_count((shared_count *)&strAddr.field_2._M_allocated_capacity)
  ;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390);
  lVar15 = 0x70;
  do {
    if (0x10 < *(uint *)((long)&local_2f0 + lVar15)) {
      free(*(void **)((long)&local_300 + lVar15));
      *(undefined8 *)((long)&local_300 + lVar15) = 0;
    }
    lVar15 = lVar15 + -0x38;
  } while (lVar15 != -0x38);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x190;
  file_02.m_begin = (iterator)&local_4d0;
  msg_02.m_end = pvVar13;
  msg_02.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4e0,
             msg_02);
  _Var5 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d0);
  local_2f0._8_8_ = local_b8;
  local_2e0 = local_b0;
  local_2d8 = local_a8;
  uStack_2d0 = uStack_a0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_2c8,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_190);
  local_2b0 = local_178;
  local_2a8 = local_170;
  local_2a0 = local_168;
  uStack_298 = uStack_160;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_300;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390,__l_00,
             (allocator_type *)&octet1);
  _cVar16 = 0x22c542;
  bVar6 = AddrMan::Add((AddrMan *)
                       _Var5._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_390,
                       (CNetAddr *)&local_258.indirect_contents,(seconds)0x0);
  strAddr._M_dataplus._M_p._0_1_ = bVar6;
  strAddr._M_string_length = 0;
  strAddr.field_2._M_allocated_capacity = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19ee3b;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe5a67e;
  local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
  local_410[0] = &PTR__lazy_ostream_013ae1c8;
  local_400[0] = boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4e8 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_400[1] = (undefined1 *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strAddr,(lazy_ostream *)local_410,1,0,WARN,_cVar16,
             (size_t)&local_4f0,400);
  boost::detail::shared_count::~shared_count((shared_count *)&strAddr.field_2._M_allocated_capacity)
  ;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390);
  lVar15 = 0x38;
  do {
    if (0x10 < *(uint *)((long)&local_2f0 + lVar15)) {
      free(*(void **)((long)&local_300 + lVar15));
      *(undefined8 *)((long)&local_300 + lVar15) = 0;
    }
    lVar15 = lVar15 + -0x38;
  } while (lVar15 != -0x38);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x192;
  file_03.m_begin = (iterator)&local_500;
  msg_03.m_end = pvVar13;
  msg_03.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_510,
             msg_03);
  strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
  strAddr._M_dataplus._M_p = "B";
  strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  percent23 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  _octet2 = &percent23;
  local_430 = &local_600;
  local_600._0_4_ = 5;
  local_390._M_string_length = 0;
  local_390.field_2._M_allocated_capacity = 0;
  _octet1 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  local_2f0._8_8_ = &octet2;
  local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
  local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_400[1] = (undefined1 *)&local_430;
  local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
  local_410[0] = &PTR__lazy_ostream_013ae108;
  local_400[0] = boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_390._M_dataplus._M_p._0_1_ =
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == 0x118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe5a67f,
             (size_t)&octet1,0x192,&local_300,"5U",(lazy_ostream *)local_410);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_390.field_2._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x194;
  file_04.m_begin = (iterator)&local_528;
  msg_04.m_end = pvVar13;
  msg_04.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_538,
             msg_04);
  strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
  strAddr._M_dataplus._M_p = "B";
  strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                   (optional<Network>)0x0,true);
  percent23 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_600 = CONCAT44(local_600._4_4_,1);
  local_390._M_dataplus._M_p._0_1_ =
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == 0x38;
  local_390._M_string_length = 0;
  local_390.field_2._M_allocated_capacity = 0;
  _octet1 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  _octet2 = &percent23;
  local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
  local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2f0._8_8_ = &octet2;
  local_430 = &local_600;
  local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
  local_410[0] = &PTR__lazy_ostream_013ae108;
  local_400[0] = boost::unit_test::lazy_ostream::inst;
  local_400[1] = (undefined1 *)&local_430;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe5a6ac,
             (size_t)&octet1,0x194,&local_300,"1U",(lazy_ostream *)local_410);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_390.field_2._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x197;
  file_05.m_begin = (iterator)&local_548;
  msg_05.m_end = pvVar13;
  msg_05.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_558,
             msg_05);
  _Var5 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_348.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_70);
  local_330 = local_58;
  local_328 = local_50;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_348.indirect_contents);
  local_2f0._8_8_ = local_330;
  local_2e0 = local_328;
  local_2d8 = 100000000;
  uStack_2d0 = 0;
  tVar7 = NodeClock::now();
  _cVar16 = 0x22ca78;
  bVar6 = AddrMan::Good((AddrMan *)
                        _Var5._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                        (CService *)&local_300.indirect_contents,
                        (NodeSeconds)((long)tVar7.__d.__r / 1000000000));
  strAddr._M_dataplus._M_p._0_1_ = bVar6;
  strAddr._M_string_length = 0;
  strAddr.field_2._M_allocated_capacity = 0;
  local_390._M_dataplus._M_p = "addrman->Good(CAddress(addr1, NODE_NONE))";
  local_390._M_string_length = 0xe5a593;
  local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
  local_410[0] = &PTR__lazy_ostream_013ae1c8;
  local_400[0] = boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_560 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_400[1] = (undefined1 *)&local_390;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strAddr,(lazy_ostream *)local_410,1,0,WARN,_cVar16,
             (size_t)&local_568,0x197);
  boost::detail::shared_count::~shared_count((shared_count *)&strAddr.field_2._M_allocated_capacity)
  ;
  if (0x10 < (uint)local_2f0._M_allocated_capacity._0_4_) {
    free(local_300.indirect_contents.indirect);
    local_300.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_338) {
    free(local_348.indirect_contents.indirect);
    local_348.indirect_contents.indirect = (char *)0x0;
  }
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x198;
  file_06.m_begin = (iterator)&local_578;
  msg_06.m_end = pvVar13;
  msg_06.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_588,
             msg_06);
  _Var5 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_370.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d0);
  local_358 = local_b8;
  local_350 = local_b0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_370.indirect_contents);
  local_2f0._8_8_ = local_358;
  local_2e0 = local_350;
  local_2d8 = 100000000;
  uStack_2d0 = NODE_NONE;
  tVar7 = NodeClock::now();
  _cVar16 = 0x22cc2f;
  bVar6 = AddrMan::Good((AddrMan *)
                        _Var5._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                        (CService *)&local_300.indirect_contents,
                        (NodeSeconds)((long)tVar7.__d.__r / 1000000000));
  strAddr._M_dataplus._M_p._0_1_ = bVar6;
  strAddr._M_string_length = 0;
  strAddr.field_2._M_allocated_capacity = 0;
  local_390._M_dataplus._M_p = "addrman->Good(CAddress(addr2, NODE_NONE))";
  local_390._M_string_length = 0xe5a5bd;
  local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
  local_410[0] = &PTR__lazy_ostream_013ae1c8;
  local_400[0] = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_590 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_400[1] = (undefined1 *)&local_390;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strAddr,(lazy_ostream *)local_410,1,0,WARN,_cVar16,
             (size_t)&local_598,0x198);
  boost::detail::shared_count::~shared_count((shared_count *)&strAddr.field_2._M_allocated_capacity)
  ;
  if (0x10 < (uint)local_2f0._M_allocated_capacity._0_4_) {
    free(local_300.indirect_contents.indirect);
    local_300.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_360) {
    free(local_370.indirect_contents.indirect);
    local_370.indirect_contents.indirect = (char *)0x0;
  }
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x199;
  file_07.m_begin = (iterator)&local_5a8;
  msg_07.m_end = pvVar13;
  msg_07.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_5b8,
             msg_07);
  strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
  strAddr._M_dataplus._M_p = "B";
  strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  percent23 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_600._0_4_ = 5;
  local_390._M_string_length = 0;
  local_390.field_2._M_allocated_capacity = 0;
  _octet1 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  _octet2 = &percent23;
  local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
  local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2f0._8_8_ = &octet2;
  local_430 = &local_600;
  local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
  local_410[0] = &PTR__lazy_ostream_013ae108;
  local_400[0] = boost::unit_test::lazy_ostream::inst;
  local_400[1] = (undefined1 *)&local_430;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_390._M_dataplus._M_p._0_1_ =
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == 0x118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe5a67f,
             (size_t)&octet1,0x199,&local_300,"5U",(lazy_ostream *)local_410);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_390.field_2._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x19a;
  file_08.m_begin = (iterator)&local_5c8;
  msg_08.m_end = pvVar13;
  msg_08.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5d8,
             msg_08);
  strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
  strAddr._M_dataplus._M_p = "B";
  strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                   (optional<Network>)0x0,true);
  percent23 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_600 = CONCAT44(local_600._4_4_,1);
  local_390._M_dataplus._M_p._0_1_ =
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == 0x38;
  local_390._M_string_length = 0;
  local_390.field_2._M_allocated_capacity = 0;
  _octet1 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  _octet2 = &percent23;
  local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
  local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2f0._8_8_ = &octet2;
  local_430 = &local_600;
  local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
  local_410[0] = &PTR__lazy_ostream_013ae108;
  local_400[0] = boost::unit_test::lazy_ostream::inst;
  local_400[1] = (undefined1 *)&local_430;
  uVar14 = 1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe5a6ac,
             (size_t)&octet1,0x19a,&local_300,"1U",(lazy_ostream *)local_410);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_390.field_2._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  do {
    _octet1 = (char *)(CONCAT44(uStack_41c,uVar14) & 0xffffffff000000ff);
    _octet2 = (size_t *)CONCAT44(uStack_424,uVar14 >> 8);
    util::ToString<int>(&local_390,&octet1);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_390,".");
    local_410[0] = local_400;
    pp_Var2 = (_func_int **)(pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pp_Var2 == paVar10) {
      local_400[0] = (undefined1 *)paVar10->_M_allocated_capacity;
      local_400[1] = *(undefined1 **)((long)&pbVar8->field_2 + 8);
    }
    else {
      local_400[0] = (undefined1 *)paVar10->_M_allocated_capacity;
      local_410[0] = pp_Var2;
    }
    local_410[1] = (undefined **)pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    util::ToString<int>((string *)&vAddr,&octet2);
    pCVar11 = (pointer)0xf;
    if (local_410[0] != local_400) {
      pCVar11 = (pointer)local_400[0];
    }
    pCVar1 = (pointer)(((vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish)->super_CService).super_CNetAddr.m_addr.
                       _union.direct + (long)local_410[1]);
    if (pCVar11 < pCVar1) {
      pCVar11 = (pointer)0xf;
      if (vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        pCVar11 = vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      if (pCVar11 < pCVar1) goto LAB_0022d1a8;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((string *)&vAddr,0,0,(char *)local_410[0],(size_type)local_410[1]);
    }
    else {
LAB_0022d1a8:
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_410,
                         (char *)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                         (size_type)
                         vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    local_300.indirect_contents.indirect = (char *)&local_2f0;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if (paVar3 == paVar10) {
      local_2f0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2f0._8_8_ = *(long *)((long)&pbVar8->field_2 + 8);
    }
    else {
      local_2f0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_300.indirect_contents.indirect = (char *)paVar3;
    }
    local_300._8_8_ = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    paVar10->_M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_300.indirect_contents,".1.23");
    strAddr._M_dataplus._M_p = (pointer)&strAddr.field_2;
    pcVar4 = (pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar10) {
      strAddr.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      strAddr.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    }
    else {
      strAddr.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      strAddr._M_dataplus._M_p = pcVar4;
    }
    strAddr._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300.indirect_contents.indirect != &local_2f0) {
      operator_delete(local_300.indirect_contents.indirect,
                      (ulong)(local_2f0._M_allocated_capacity + 1));
    }
    if (vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)((long)&((vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_CService).super_CNetAddr.m_addr._union + 1));
    }
    if (local_410[0] != local_400) {
      operator_delete(local_410[0],(ulong)((long)local_400[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    ResolveService((CService *)&local_3d8.indirect_contents,&strAddr,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3d8.indirect_contents);
    local_2f0._8_8_ = local_3c0;
    local_2e0 = local_3b8;
    local_2d8 = 100000000;
    uStack_2d0 = NODE_NONE;
    if (0x10 < local_3c8) {
      free(local_3d8.indirect_contents.indirect);
      local_3d8.indirect_contents.indirect = (char *)0x0;
    }
    tVar7 = NodeClock::now();
    _Var5 = addrman;
    local_2d8 = (long)tVar7.__d.__r / 1000000000;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_410,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300.indirect_contents);
    local_400[1] = (undefined1 *)local_2f0._8_8_;
    local_3f0 = local_2e0;
    local_3e8 = local_2d8;
    uStack_3e0 = uStack_2d0;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_410;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              (&vAddr,__l_01,(allocator_type *)&local_430);
    ResolveIP((CNetAddr *)&local_390,&strAddr);
    AddrMan::Add((AddrMan *)
                 _Var5._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,(CNetAddr *)&local_390,
                 (seconds)0x0);
    if (0x10 < (uint)local_390.field_2._M_allocated_capacity._0_4_) {
      free(local_390._M_dataplus._M_p);
    }
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
    if (0x10 < (uint)local_400[0]._0_4_) {
      free(local_410[0]);
    }
    _Var5._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
         addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
         super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
         super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
    if ((uVar14 & 7) == 0) {
      tVar7 = NodeClock::now();
      AddrMan::Good((AddrMan *)
                    _Var5._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (CService *)&local_300.indirect_contents,
                    (NodeSeconds)((long)tVar7.__d.__r / 1000000000));
    }
    if (0x10 < (uint)local_2f0._M_allocated_capacity._0_4_) {
      free(local_300.indirect_contents.indirect);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strAddr._M_dataplus._M_p != &strAddr.field_2) {
      operator_delete(strAddr._M_dataplus._M_p,strAddr.field_2._M_allocated_capacity + 1);
    }
    uVar14 = uVar14 + 1;
    if (uVar14 == 0x800) {
      pvVar12 = (iterator)0x0;
      pvVar13 = (iterator)0x1;
      AddrMan::GetAddr(&vAddr,(AddrMan *)
                              addrman._M_t.
                              super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                              super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                              super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                       (optional<Network>)0x0,true);
      sVar9 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
      percent23 = (sVar9 * 0x17) / 100;
      local_5e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_5e0 = "";
      local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_09.m_end = (iterator)0x1ac;
      file_09.m_begin = (iterator)&local_5e8;
      msg_09.m_end = pvVar13;
      msg_09.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5f8,
                 msg_09);
      strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
      strAddr._M_dataplus._M_p = "B";
      strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_600 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      local_390._M_string_length = 0;
      local_390.field_2._M_allocated_capacity = 0;
      _octet1 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_418 = "";
      _octet2 = &local_600;
      local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
      local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
      local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_2f0._8_8_ = &octet2;
      local_430 = &percent23;
      local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
      local_410[0] = &PTR__lazy_ostream_013ae0c8;
      local_400[0] = boost::unit_test::lazy_ostream::inst;
      local_400[1] = (undefined1 *)&local_430;
      pvVar12 = (iterator)0x1;
      pvVar13 = (iterator)0x2;
      local_390._M_dataplus._M_p._0_1_ = local_600 - percent23 == 0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe5a6e3,
                 (size_t)&octet1,0x1ac,&local_300,"percent23",local_410);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_390.field_2._M_allocated_capacity);
      local_610 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_608 = "";
      local_620 = &boost::unit_test::basic_cstring<char_const>::null;
      local_618 = &boost::unit_test::basic_cstring<char_const>::null;
      file_10.m_end = (iterator)0x1ad;
      file_10.m_begin = (iterator)&local_610;
      msg_10.m_end = pvVar13;
      msg_10.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_620,
                 msg_10);
      strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
      strAddr._M_dataplus._M_p = "B";
      strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_600 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      local_390._M_dataplus._M_p._0_1_ =
           (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start == 0x64d8;
      local_624 = 0x1cd;
      local_390._M_string_length = 0;
      local_390.field_2._M_allocated_capacity = 0;
      _octet1 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_418 = "";
      _octet2 = &local_600;
      local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
      local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
      local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_2f0._8_8_ = &octet2;
      local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
      local_410[0] = &PTR__lazy_ostream_013ae108;
      local_400[0] = boost::unit_test::lazy_ostream::inst;
      local_400[1] = (undefined1 *)&local_430;
      pvVar12 = (iterator)0x1;
      pvVar13 = (iterator)0x2;
      local_430 = (size_t *)&local_624;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe5a6e3,
                 (size_t)&octet1,0x1ad,&local_300,"461U",local_410);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_390.field_2._M_allocated_capacity);
      local_638 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_630 = "";
      local_648 = &boost::unit_test::basic_cstring<char_const>::null;
      local_640 = &boost::unit_test::basic_cstring<char_const>::null;
      file_11.m_end = (iterator)0x1af;
      file_11.m_begin = (iterator)&local_638;
      msg_11.m_end = pvVar13;
      msg_11.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_648,
                 msg_11);
      strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
      strAddr._M_dataplus._M_p = "B";
      strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_600 = AddrMan::Size((AddrMan *)
                                addrman._M_t.
                                super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                                super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                                super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                (optional<Network>)0x0,(optional<bool>)0x0);
      local_624 = 0x7d6;
      local_390._M_dataplus._M_p._0_1_ = local_600 == 0x7d6;
      local_390._M_string_length = 0;
      local_390.field_2._M_allocated_capacity = 0;
      _octet1 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_418 = "";
      _octet2 = &local_600;
      local_300._8_8_ = local_300._8_8_ & 0xffffffffffffff00;
      local_300.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
      local_2f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_2f0._8_8_ = &octet2;
      local_410[1] = (undefined **)((ulong)local_410[1] & 0xffffffffffffff00);
      local_410[0] = &PTR__lazy_ostream_013ae108;
      local_400[0] = boost::unit_test::lazy_ostream::inst;
      local_400[1] = (undefined1 *)&local_430;
      local_430 = (size_t *)&local_624;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe59af2,
                 (size_t)&octet1,0x1af,&local_300,"2006U",local_410);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_390.field_2._M_allocated_capacity);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
      if (0x10 < local_248) {
        free((void *)CONCAT44(local_258._4_4_,local_258._0_4_));
      }
      if (0x10 < local_228) {
        free(local_238.indirect_contents.indirect);
      }
      if (0x10 < local_1e0) {
        free(local_1f0.indirect_contents.indirect);
      }
      if (0x10 < local_180) {
        free(local_190[0]);
      }
      if (0x10 < (uint)sStack_120.pi_) {
        free((void *)CONCAT71(local_130._1_7_,local_130.direct[0]));
      }
      if (0x10 < (uint)local_d0._16_4_) {
        free((void *)local_d0._0_8_);
      }
      if (0x10 < (uint)local_60) {
        free(local_70[0]);
      }
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr1);
      std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_getaddr)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    // Test: Sanity check, GetAddr should never return anything if addrman
    //  is empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    std::vector<CAddress> vAddr1 = addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt);
    BOOST_CHECK_EQUAL(vAddr1.size(), 0U);

    CAddress addr1 = CAddress(ResolveService("250.250.2.1", 8333), NODE_NONE);
    addr1.nTime = Now<NodeSeconds>(); // Set time so isTerrible = false
    CAddress addr2 = CAddress(ResolveService("250.251.2.2", 9999), NODE_NONE);
    addr2.nTime = Now<NodeSeconds>();
    CAddress addr3 = CAddress(ResolveService("251.252.2.3", 8333), NODE_NONE);
    addr3.nTime = Now<NodeSeconds>();
    CAddress addr4 = CAddress(ResolveService("252.253.3.4", 8333), NODE_NONE);
    addr4.nTime = Now<NodeSeconds>();
    CAddress addr5 = CAddress(ResolveService("252.254.4.5", 8333), NODE_NONE);
    addr5.nTime = Now<NodeSeconds>();
    CNetAddr source1 = ResolveIP("250.1.2.1");
    CNetAddr source2 = ResolveIP("250.2.3.3");

    // Test: Ensure GetAddr works with new addresses.
    BOOST_CHECK(addrman->Add({addr1, addr3, addr5}, source1));
    BOOST_CHECK(addrman->Add({addr2, addr4}, source2));

    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt).size(), 5U);
    // Net processing asks for 23% of addresses. 23% of 5 is 1 rounded down.
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt).size(), 1U);

    // Test: Ensure GetAddr works with new and tried addresses.
    BOOST_CHECK(addrman->Good(CAddress(addr1, NODE_NONE)));
    BOOST_CHECK(addrman->Good(CAddress(addr2, NODE_NONE)));
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt).size(), 5U);
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt).size(), 1U);

    // Test: Ensure GetAddr still returns 23% when addrman has many addrs.
    for (unsigned int i = 1; i < (8 * 256); i++) {
        int octet1 = i % 256;
        int octet2 = i >> 8 % 256;
        std::string strAddr = ToString(octet1) + "." + ToString(octet2) + ".1.23";
        CAddress addr = CAddress(ResolveService(strAddr), NODE_NONE);

        // Ensure that for all addrs in addrman, isTerrible == false.
        addr.nTime = Now<NodeSeconds>();
        addrman->Add({addr}, ResolveIP(strAddr));
        if (i % 8 == 0)
            addrman->Good(addr);
    }
    std::vector<CAddress> vAddr = addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt);

    size_t percent23 = (addrman->Size() * 23) / 100;
    BOOST_CHECK_EQUAL(vAddr.size(), percent23);
    BOOST_CHECK_EQUAL(vAddr.size(), 461U);
    // (addrman.Size() < number of addresses added) due to address collisions.
    BOOST_CHECK_EQUAL(addrman->Size(), 2006U);
}